

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O2

FT_Fixed FT_Vector_Length(FT_Vector *vec)

{
  FT_Int FVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  FT_Vector local_28;
  
  if (vec == (FT_Vector *)0x0) {
    uVar2 = 0;
  }
  else {
    local_28.x = vec->x;
    local_28.y = vec->y;
    if (local_28.x == 0) {
      uVar2 = -local_28.y;
      if (0 < local_28.y) {
        uVar2 = local_28.y;
      }
    }
    else if (local_28.y == 0) {
      uVar2 = -local_28.x;
      if (0 < local_28.x) {
        uVar2 = local_28.x;
      }
    }
    else {
      FVar1 = ft_trig_prenorm(&local_28);
      ft_trig_pseudo_polarize(&local_28);
      uVar2 = -local_28.x;
      if (0 < local_28.x) {
        uVar2 = local_28.x;
      }
      uVar4 = uVar2 * 0xdbd95b16 + 0x40000000 >> 0x20;
      uVar2 = -uVar4;
      if (-1 < local_28.x) {
        uVar2 = uVar4;
      }
      bVar3 = (byte)FVar1;
      if (FVar1 < 1) {
        uVar2 = (ulong)(uint)((int)uVar2 << (-bVar3 & 0x1f));
      }
      else {
        uVar2 = (long)(uVar2 + (1L << (bVar3 - 1 & 0x3f))) >> (bVar3 & 0x3f);
      }
    }
  }
  return uVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Fixed )
  FT_Vector_Length( FT_Vector*  vec )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec )
      return 0;

    v = *vec;

    /* handle trivial cases */
    if ( v.x == 0 )
    {
      return FT_ABS( v.y );
    }
    else if ( v.y == 0 )
    {
      return FT_ABS( v.x );
    }

    /* general case */
    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    v.x = ft_trig_downscale( v.x );

    if ( shift > 0 )
      return ( v.x + ( 1L << ( shift - 1 ) ) ) >> shift;

    return (FT_Fixed)( (FT_UInt32)v.x << -shift );
  }